

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

int mpc_nodecount_unretained(mpc_parser_t *p,int force)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = 0;
  iVar4 = 1;
  while ((force != 0 || (p->retained == '\0'))) {
    lVar3 = 8;
    switch(p->type) {
    default:
      goto switchD_0010915f_caseD_6;
    case '\x14':
    case '\x15':
    case '\x16':
      lVar3 = 0x18;
    case '\x05':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
    case '\x19':
    case '\x1a':
      p = *(mpc_parser_t **)((long)&p->name + lVar3);
      iVar5 = iVar5 + 1;
      force = 0;
      break;
    case '\x17':
      lVar3 = (long)(p->data).repeat.n;
      if (0 < lVar3) {
        pvVar1 = (p->data).lift.x;
        iVar4 = 1;
        lVar6 = 0;
        do {
          iVar2 = mpc_nodecount_unretained(*(mpc_parser_t **)((long)pvVar1 + lVar6 * 8),0);
          iVar4 = iVar4 + iVar2;
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
      goto switchD_0010915f_caseD_6;
    case '\x18':
      lVar3 = (long)(p->data).repeat.n;
      if (0 < lVar3) {
        pvVar1 = (p->data).apply_to.d;
        iVar4 = 1;
        lVar6 = 0;
        do {
          iVar2 = mpc_nodecount_unretained(*(mpc_parser_t **)((long)pvVar1 + lVar6 * 8),0);
          iVar4 = iVar4 + iVar2;
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
      goto switchD_0010915f_caseD_6;
    }
  }
  iVar4 = 0;
switchD_0010915f_caseD_6:
  return iVar4 + iVar5;
}

Assistant:

static int mpc_nodecount_unretained(mpc_parser_t* p, int force) {

  int i, total;

  if (p->retained && !force) { return 0; }

  if (p->type == MPC_TYPE_EXPECT) { return 1 + mpc_nodecount_unretained(p->data.expect.x, 0); }

  if (p->type == MPC_TYPE_APPLY)    { return 1 + mpc_nodecount_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO) { return 1 + mpc_nodecount_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)  { return 1 + mpc_nodecount_unretained(p->data.predict.x, 0); }

  if (p->type == MPC_TYPE_CHECK)    { return 1 + mpc_nodecount_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { return 1 + mpc_nodecount_unretained(p->data.check_with.x, 0); }

  if (p->type == MPC_TYPE_NOT)   { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE) { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }

  if (p->type == MPC_TYPE_MANY)  { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    total = 1;
    for(i = 0; i < p->data.or.n; i++) {
      total += mpc_nodecount_unretained(p->data.or.xs[i], 0);
    }
    return total;
  }

  if (p->type == MPC_TYPE_AND) {
    total = 1;
    for(i = 0; i < p->data.and.n; i++) {
      total += mpc_nodecount_unretained(p->data.and.xs[i], 0);
    }
    return total;
  }

  return 1;

}